

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_estimateCStreamSize_usingCCtxParams(ZSTD_CCtx_params *params)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ZSTD_compressionParameters cParams;
  ZSTD_compressionParameters local_34;
  
  if (0 < params->nbWorkers) {
    return 0xffffffffffffffff;
  }
  ZSTD_getCParamsFromCCtxParams(&local_34,params,0xffffffffffffffff,0);
  sVar1 = ZSTD_estimateCCtxSize_usingCCtxParams(params);
  uVar2 = 1L << ((byte)local_34.windowLog & 0x3f);
  uVar3 = 0x20000;
  if (uVar2 < 0x20000) {
    uVar3 = uVar2;
  }
  uVar4 = (ulong)(0x20000 - (uint)uVar3 >> 0xb);
  if (0x10 < local_34.windowLog) {
    uVar4 = 0;
  }
  return uVar2 + sVar1 + (ulong)((uint)uVar3 >> 8) + (uVar3 & 0xffffffff) * 2 + uVar4 + 1;
}

Assistant:

size_t ZSTD_estimateCStreamSize_usingCCtxParams(const ZSTD_CCtx_params* params)
{
    RETURN_ERROR_IF(params->nbWorkers > 0, GENERIC, "Estimate CCtx size is supported for single-threaded compression only.");
    {   ZSTD_compressionParameters const cParams =
                ZSTD_getCParamsFromCCtxParams(params, ZSTD_CONTENTSIZE_UNKNOWN, 0);
        size_t const CCtxSize = ZSTD_estimateCCtxSize_usingCCtxParams(params);
        size_t const blockSize = MIN(ZSTD_BLOCKSIZE_MAX, (size_t)1 << cParams.windowLog);
        size_t const inBuffSize = ((size_t)1 << cParams.windowLog) + blockSize;
        size_t const outBuffSize = ZSTD_compressBound(blockSize) + 1;
        size_t const streamingSize = ZSTD_cwksp_alloc_size(inBuffSize)
                                   + ZSTD_cwksp_alloc_size(outBuffSize);

        return CCtxSize + streamingSize;
    }
}